

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesturemanager.cpp
# Opt level: O2

void __thiscall QGestureManager::QGestureManager(QGestureManager *this,QObject *parent)

{
  char cVar1;
  int pointCount;
  QPanGestureRecognizer *this_00;
  QGestureRecognizer *pQVar2;
  long in_FS_OFFSET;
  char local_50 [24];
  char *local_38;
  bool ok;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::QObject((QObject *)this,parent);
  *(undefined ***)this = &PTR_metaObject_007c05c0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined8 *)(this + 0x40) = 0;
  *(undefined4 *)(this + 0x48) = 0x100;
  *(undefined8 *)(this + 0x50) = 0;
  *(undefined8 *)(this + 0x58) = 0;
  *(undefined8 *)(this + 0x60) = 0;
  qMetaTypeId<Qt::GestureState>();
  this_00 = (QPanGestureRecognizer *)operator_new(0x10);
  cVar1 = qEnvironmentVariableIsSet("QT_PAN_TOUCHPOINTS");
  pointCount = 2;
  if (cVar1 != '\0') {
    ok = true;
    pointCount = qEnvironmentVariableIntValue("QT_PAN_TOUCHPOINTS",&ok);
    if ((pointCount < 1) || (ok == false)) {
      local_50[0] = '\x02';
      local_50[1] = '\0';
      local_50[2] = '\0';
      local_50[3] = '\0';
      local_50[0x14] = '\0';
      local_50[0x15] = '\0';
      local_50[0x16] = '\0';
      local_50[0x17] = '\0';
      local_50[4] = '\0';
      local_50[5] = '\0';
      local_50[6] = '\0';
      local_50[7] = '\0';
      local_50[8] = '\0';
      local_50[9] = '\0';
      local_50[10] = '\0';
      local_50[0xb] = '\0';
      local_50[0xc] = '\0';
      local_50[0xd] = '\0';
      local_50[0xe] = '\0';
      local_50[0xf] = '\0';
      local_50[0x10] = '\0';
      local_50[0x11] = '\0';
      local_50[0x12] = '\0';
      local_50[0x13] = '\0';
      local_38 = "default";
      QMessageLogger::warning(local_50,"Ignoring invalid value of %s","QT_PAN_TOUCHPOINTS");
      pointCount = 2;
    }
  }
  QPanGestureRecognizer::QPanGestureRecognizer(this_00,pointCount);
  registerGestureRecognizer(this,(QGestureRecognizer *)this_00);
  pQVar2 = (QGestureRecognizer *)operator_new(8);
  QPinchGestureRecognizer::QPinchGestureRecognizer((QPinchGestureRecognizer *)pQVar2);
  registerGestureRecognizer(this,pQVar2);
  pQVar2 = (QGestureRecognizer *)operator_new(8);
  QSwipeGestureRecognizer::QSwipeGestureRecognizer((QSwipeGestureRecognizer *)pQVar2);
  registerGestureRecognizer(this,pQVar2);
  pQVar2 = (QGestureRecognizer *)operator_new(8);
  QTapGestureRecognizer::QTapGestureRecognizer((QTapGestureRecognizer *)pQVar2);
  registerGestureRecognizer(this,pQVar2);
  pQVar2 = (QGestureRecognizer *)operator_new(8);
  QTapAndHoldGestureRecognizer::QTapAndHoldGestureRecognizer((QTapAndHoldGestureRecognizer *)pQVar2)
  ;
  registerGestureRecognizer(this,pQVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QGestureManager::QGestureManager(QObject *parent)
    : QObject(parent), m_lastCustomGestureId(Qt::CustomGesture)
{
    qRegisterMetaType<Qt::GestureState>();

#if defined(Q_OS_MACOS)
    registerGestureRecognizer(new QMacSwipeGestureRecognizer);
    registerGestureRecognizer(new QMacPinchGestureRecognizer);
    registerGestureRecognizer(new QMacPanGestureRecognizer);
#else
    registerGestureRecognizer(new QPanGestureRecognizer(panTouchPoints()));
    registerGestureRecognizer(new QPinchGestureRecognizer);
    registerGestureRecognizer(new QSwipeGestureRecognizer);
    registerGestureRecognizer(new QTapGestureRecognizer);
#endif
    registerGestureRecognizer(new QTapAndHoldGestureRecognizer);
}